

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

CBlockIndex * __thiscall Chainstate::FindForkInGlobalIndex(Chainstate *this,CBlockLocator *locator)

{
  int iVar1;
  long lVar2;
  pointer puVar3;
  pointer ppCVar4;
  CBlockIndex *this_00;
  CBlockIndex *pCVar5;
  uint256 *hash;
  pointer hash_00;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (hash_00 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start; hash_00 != puVar3; hash_00 = hash_00 + 1) {
    this_00 = ::node::BlockManager::LookupBlockIndex(this->m_blockman,hash_00);
    if (this_00 != (CBlockIndex *)0x0) {
      iVar1 = this_00->nHeight;
      if (((long)iVar1 < 0) ||
         (ppCVar4 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
         (int)((ulong)((long)(this->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4) >> 3) <=
         iVar1)) {
        pCVar5 = (CBlockIndex *)0x0;
      }
      else {
        pCVar5 = ppCVar4[iVar1];
      }
      if (pCVar5 == this_00) goto LAB_003e9cf6;
      pCVar5 = CBlockIndex::GetAncestor
                         (this_00,(int)((ulong)((long)(this->m_chain).vChain.
                                                                                                            
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(this->m_chain).vChain.
                                                                                                          
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                  -1);
      ppCVar4 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar4 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        if (pCVar5 == (CBlockIndex *)0x0) goto LAB_003e9cf4;
      }
      else {
        this_00 = ppCVar4[-1];
        if (pCVar5 == this_00) goto LAB_003e9cf6;
      }
    }
  }
  ppCVar4 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppCVar4) {
LAB_003e9cf4:
    this_00 = (CBlockIndex *)0x0;
  }
  else {
    this_00 = *ppCVar4;
  }
LAB_003e9cf6:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

const CBlockIndex* Chainstate::FindForkInGlobalIndex(const CBlockLocator& locator) const
{
    AssertLockHeld(cs_main);

    // Find the latest block common to locator and chain - we expect that
    // locator.vHave is sorted descending by height.
    for (const uint256& hash : locator.vHave) {
        const CBlockIndex* pindex{m_blockman.LookupBlockIndex(hash)};
        if (pindex) {
            if (m_chain.Contains(pindex)) {
                return pindex;
            }
            if (pindex->GetAncestor(m_chain.Height()) == m_chain.Tip()) {
                return m_chain.Tip();
            }
        }
    }
    return m_chain.Genesis();
}